

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::sync_weights(vw *all)

{
  float fVar1;
  double dVar2;
  weight *pwVar3;
  uint64_t uVar4;
  uint32_t uVar5;
  __node_base *p_Var6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  dVar2 = all->sd->gravity;
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) && (dVar2 = all->sd->contraction, dVar2 == 1.0)) &&
     (!NAN(dVar2))) {
    return;
  }
  if ((all->weights).sparse == true) {
    p_Var6 = &(all->weights).sparse_weights._map._M_h._M_before_begin;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      fVar1 = *(float *)&(*(_Hash_node_base **)
                           &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)->_M_nxt;
      fVar8 = (float)all->sd->gravity;
      fVar9 = 0.0;
      if (fVar8 < ABS(fVar1)) {
        fVar9 = fVar8 * *(float *)(&DAT_00249ff0 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
      }
      *(float *)&(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)
                 ->_M_nxt = (float)all->sd->contraction * fVar9;
    }
  }
  else {
    uVar5 = (all->weights).dense_weights._stride_shift;
    pwVar3 = (all->weights).dense_weights._begin;
    uVar4 = (all->weights).dense_weights._weight_mask;
    for (lVar7 = 0; uVar4 * 4 + 4 != lVar7; lVar7 = lVar7 + (1L << ((byte)uVar5 & 0x3f)) * 4) {
      fVar1 = *(float *)((long)pwVar3 + lVar7);
      fVar8 = (float)all->sd->gravity;
      fVar9 = 0.0;
      if (fVar8 < ABS(fVar1)) {
        fVar9 = fVar8 * *(float *)(&DAT_00249ff0 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
      }
      *(float *)((long)pwVar3 + lVar7) = (float)all->sd->contraction * fVar9;
    }
  }
  all->sd->gravity = 0.0;
  all->sd->contraction = 1.0;
  return;
}

Assistant:

void sync_weights(vw& all)
{
  // todo, fix length dependence
  if (all.sd->gravity == 0. && all.sd->contraction == 1.)  // to avoid unnecessary weight synchronization
    return;

  if (all.weights.sparse)
    for (weight& w : all.weights.sparse_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;
  else
    for (weight& w : all.weights.dense_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;

  all.sd->gravity = 0.;
  all.sd->contraction = 1.;
}